

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig::operator==
          (JavaHprofConfig_ContinuousDumpConfig *this,JavaHprofConfig_ContinuousDumpConfig *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  if (((_Var1) && (this->dump_phase_ms_ == other->dump_phase_ms_)) &&
     (this->dump_interval_ms_ == other->dump_interval_ms_)) {
    bVar2 = this->scan_pids_only_on_start_ == other->scan_pids_only_on_start_;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool JavaHprofConfig_ContinuousDumpConfig::operator==(const JavaHprofConfig_ContinuousDumpConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && dump_phase_ms_ == other.dump_phase_ms_
   && dump_interval_ms_ == other.dump_interval_ms_
   && scan_pids_only_on_start_ == other.scan_pids_only_on_start_;
}